

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void ObsGetDiscard(pyhanabi_observation_t *observation,int index,pyhanabi_card_t *card)

{
  int iVar1;
  int *in_RDX;
  long *in_RDI;
  HanabiCard hanabi_card;
  size_type in_stack_ffffffffffffffd8;
  HanabiCard in_stack_ffffffffffffffe0;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("observation != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d7,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RDX != (int *)0x0) {
      hanabi_learning_env::HanabiObservation::DiscardPile((HanabiObservation *)*in_RDI);
      std::vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
      ::at((vector<hanabi_learning_env::HanabiCard,_std::allocator<hanabi_learning_env::HanabiCard>_>
            *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      iVar1 = hanabi_learning_env::HanabiCard::Color((HanabiCard *)&stack0xffffffffffffffe0);
      *in_RDX = iVar1;
      iVar1 = hanabi_learning_env::HanabiCard::Rank((HanabiCard *)&stack0xffffffffffffffe0);
      in_RDX[1] = iVar1;
      return;
    }
    __assert_fail("card != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                  ,0x2d9,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
  }
  __assert_fail("observation->observation != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MBlogs[P]mcts-hanabi/pyhanabi.cc"
                ,0x2d8,"void ObsGetDiscard(pyhanabi_observation_t *, int, pyhanabi_card_t *)");
}

Assistant:

void ObsGetDiscard(pyhanabi_observation_t* observation, int index,
                   pyhanabi_card_t* card) {
  REQUIRE(observation != nullptr);
  REQUIRE(observation->observation != nullptr);
  REQUIRE(card != nullptr);
  hanabi_learning_env::HanabiCard hanabi_card =
      reinterpret_cast<hanabi_learning_env::HanabiObservation*>(
          observation->observation)
          ->DiscardPile()
          .at(index);
  card->color = hanabi_card.Color();
  card->rank = hanabi_card.Rank();
}